

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O2

bool __thiscall RealTrafficConnection::ProcessFetchedData(RealTrafficConnection *this)

{
  RTRequestTypeTy RVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  JSON_Object *pJVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  rep rVar9;
  long lVar10;
  JSON_Array *pData;
  duration dVar11;
  size_t sVar12;
  JSON_Object *pBuf;
  char *pcVar13;
  uint uVar14;
  bool bVar15;
  float fVar16;
  double local_b8;
  allocator<char> local_a9;
  string s;
  string metar;
  string rMsg;
  JSONRootPtr pRoot;
  
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
    if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse != 200) {
      (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
                (this);
    }
    return false;
  }
  pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
  super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl = json_parse_string((char *)0x17a5d2);
  pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
  super__Tuple_impl<1UL,_void_(*)(json_value_t_*)>.
  super__Head_base<1UL,_void_(*)(json_value_t_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(json_value_t_*),_false>)json_value_free;
  if (pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
      super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
      super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
      super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl == (JSON_Value *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1c0,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
LAB_0017a829:
    bVar3 = false;
    goto LAB_0017aa6c;
  }
  pJVar5 = json_object(pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                       super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                       super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
                       super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl);
  if (pJVar5 == (JSON_Object *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1c2,"ProcessFetchedData",logERR,"JSON: Getting main object failed");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    goto LAB_0017a829;
  }
  lVar6 = jog_l(pJVar5,"status");
  if (lVar6 == 0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1c6,"ProcessFetchedData",logERR,"Response has no \'status\'");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    goto LAB_0017a829;
  }
  pcVar7 = jog_s(pJVar5,"message");
  std::__cxx11::string::string<std::allocator<char>>((string *)&rMsg,pcVar7,(allocator<char> *)&s);
  if (((lVar6 != 200) && ((this->curr).eRequType == RT_REQU_WEATHER)) &&
     (iVar4 = (this->rtWx).nErr, (this->rtWx).nErr = iVar4 + 1, 3 < iVar4)) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1cf,"ProcessFetchedData",logERR,
             "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
            );
    }
    CreateMsgWindow(12.0,logERR,
                    "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                   );
  }
  switch(lVar6) {
  case 0x191:
    if ((int)dataRefs.iLogLevel < 1) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1ed,"ProcessFetchedData",logDEBUG,"Session expired");
    }
    (this->curr).sGUID._M_string_length = 0;
    *(this->curr).sGUID._M_dataplus._M_p = '\0';
    rVar9 = std::chrono::_V2::steady_clock::now();
    (this->tNextWeather).__d.__r = rVar9;
    (this->tNextTraffic).__d.__r = rVar9;
    break;
  case 0x192:
  case 0x194:
    if ((this->curr).eRequType == RT_REQU_AUTH) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x1da,"ProcessFetchedData",logERR,"RealTraffic license invalid: %s",
               rMsg._M_dataplus._M_p);
      }
      CreateMsgWindow(12.0,logERR,"RealTraffic license invalid: %s",rMsg._M_dataplus._M_p);
      bVar3 = false;
      (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[7])
                (this,0,1);
      goto LAB_0017aa62;
    }
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1de,"ProcessFetchedData",logWARN,"RealTraffic returned: %s",rMsg._M_dataplus._M_p);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    goto LAB_0017aa40;
  case 0x193:
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,499,"ProcessFetchedData",logWARN,"RealTraffic forbidden: %s",rMsg._M_dataplus._M_p);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
LAB_0017aa40:
    lVar6 = std::chrono::_V2::steady_clock::now();
    (this->tNextWeather).__d.__r = lVar6 + 5000000000;
    (this->tNextTraffic).__d.__r = lVar6 + 5000000000;
    break;
  case 0x195:
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1e5,"ProcessFetchedData",logERR,"RealTraffic: %s",rMsg._M_dataplus._M_p);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    lVar6 = std::chrono::_V2::steady_clock::now();
    (this->tNextWeather).__d.__r = lVar6 + 10000000000;
    (this->tNextTraffic).__d.__r = lVar6 + 10000000000;
    (this->curr).sGUID._M_string_length = 0;
    *(this->curr).sGUID._M_dataplus._M_p = '\0';
    break;
  default:
    if (lVar6 != 200) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x1fa,"ProcessFetchedData",logERR,"RealTraffic returned an error: %s",
               rMsg._M_dataplus._M_p);
      }
      CreateMsgWindow(12.0,logERR,"RealTraffic returned an error: %s",rMsg._M_dataplus._M_p);
      (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
                (this);
      goto LAB_0017aa40;
    }
    lVar8 = jog_l(pJVar5,"rrl");
    lVar6 = jog_l(pJVar5,"wrrl");
    RVar1 = (this->curr).eRequType;
    if (RVar1 == RT_REQU_NEAREST_METAR) {
      lVar6 = 0x32;
LAB_0017aa95:
      if (0 < lVar8) goto LAB_0017aa9a;
    }
    else {
      if (RVar1 != RT_REQU_TRAFFIC) goto LAB_0017aa95;
      if (lVar8 < 0x1f41) {
        lVar8 = 8000;
      }
LAB_0017aa9a:
      lVar10 = std::chrono::_V2::steady_clock::now();
      (this->tNextTraffic).__d.__r = lVar8 * 1000000 + lVar10;
    }
    if (0 < lVar6) {
      lVar8 = std::chrono::_V2::steady_clock::now();
      (this->tNextWeather).__d.__r = lVar6 * 1000000 + lVar8;
    }
    switch((this->curr).eRequType) {
    case RT_REQU_AUTH:
      lVar6 = jog_l(pJVar5,"type");
      this->eLicType = (RTLicTypeTy)lVar6;
      jog_s(pJVar5,"GUID");
      std::__cxx11::string::assign((char *)&(this->curr).sGUID);
      if ((this->curr).sGUID._M_string_length == 0) {
        if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x21d,"ProcessFetchedData",logERR,"Did not actually receive a GUID:\n%s",
                 (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
        }
        (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8]
        )(this);
        goto LAB_0017aa60;
      }
      bVar3 = true;
      if ((int)dataRefs.iLogLevel < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x222,"ProcessFetchedData",logDEBUG,"Authenticated: type=%d, GUID=%s",
               (ulong)this->eLicType,(this->curr).sGUID._M_dataplus._M_p);
      }
      break;
    case RT_REQU_DEAUTH:
      (this->curr).sGUID._M_string_length = 0;
      *(this->curr).sGUID._M_dataplus._M_p = '\0';
      bVar3 = true;
      if ((int)dataRefs.iLogLevel < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x229,"ProcessFetchedData",logDEBUG,"De-authenticated");
      }
      break;
    case RT_REQU_PARKED:
      this->bDoParkedTraffic = false;
      pJVar5 = json_object_get_object(pJVar5,"data");
      bVar3 = ProcessParkedAcBuffer(this,pJVar5);
      break;
    case RT_REQU_NEAREST_METAR:
      pData = json_object_get_array(pJVar5,"data");
      bVar3 = true;
      ProcessNearestMETAR(this,pData);
      break;
    case RT_REQU_WEATHER:
      local_b8 = jog_n_nan(pJVar5,"data.QNH");
      if (NAN(local_b8)) {
        local_b8 = jog_n_nan(pJVar5,"data.locWX.SLP");
      }
      pcVar7 = jog_s(pJVar5,"data.locWX.Error");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,pcVar7,(allocator<char> *)&metar);
      if (s._M_string_length == 0) {
        jog_s(pJVar5,"data.locWX.Info");
        std::__cxx11::string::assign((char *)&s);
        if (s._M_string_length != 0) {
          bVar3 = std::operator!=(&s,"TinyDelta");
          if (bVar3) {
            std::__cxx11::string::substr((ulong)&metar,(ulong)&s);
            bVar3 = std::operator!=(&metar,"error:");
            std::__cxx11::string::~string((string *)&metar);
            if (bVar3) {
              s._M_string_length = 0;
              *s._M_dataplus._M_p = '\0';
            }
          }
          if (s._M_string_length != 0) goto LAB_0017abcb;
        }
        if (local_b8 < 800.0) goto LAB_0017abcb;
        jog_s(pJVar5,"data.ICAO");
        std::__cxx11::string::assign((char *)&s);
        pcVar7 = jog_s(pJVar5,"data.METAR");
        std::__cxx11::string::string<std::allocator<char>>((string *)&metar,pcVar7,&local_a9);
        if ((s._M_string_length == 0) || (bVar3 = std::operator==(&s,"UNKN"), bVar3)) {
          s._M_string_length = 0;
          *s._M_dataplus._M_p = '\0';
          metar._M_string_length = 0;
          *metar._M_dataplus._M_p = '\0';
        }
        if ((this->curr).tOff < 1) {
          fVar16 = DataRefs::SetWeather
                             (&dataRefs,(float)local_b8,(float)(this->rtWx).pos._lat,
                              (float)(this->rtWx).pos._lon,&s,&metar);
        }
        else {
          fVar16 = WeatherQNHfromMETAR(&metar);
        }
        (this->rtWx).w.qnh_pas = fVar16;
        if (!NAN(fVar16)) {
          local_b8 = (double)fVar16;
        }
        WxTy::set(&this->rtWx,local_b8,(this->curr).tOff,true);
        if ((int)dataRefs.iLogLevel < 1) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x27c,"ProcessFetchedData",logDEBUG,"Received RealTraffic Weather with QNH = %.1f"
                 ,SUB84((this->rtWx).QNH,0));
        }
        if (dataRefs.weatherCtl == WC_REAL_TRAFFIC) {
          pJVar5 = json_object_get_object(pJVar5,"data");
          ProcessWeather(this,pJVar5);
          if (NAN((this->rtWx).w.qnh_pas)) {
            (this->rtWx).w.qnh_pas = (float)(this->rtWx).QNH;
          }
        }
        std::__cxx11::string::~string((string *)&metar);
        bVar3 = true;
      }
      else {
LAB_0017abcb:
        bVar3 = std::operator==(&s,"File requested");
        if (bVar3) {
          if ((int)dataRefs.iLogLevel < 1) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,0x249,"ProcessFetchedData",logDEBUG,
                   "Weather details being fetched at RealTraffic, will try again in 60s");
          }
        }
        else if (s._M_string_length == 0) {
          if ((int)dataRefs.iLogLevel < 4) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,0x251,"ProcessFetchedData",logERR,
                   "RealTraffic returned no or invalid local pressure %.1f:\n%s",SUB84(local_b8,0),
                   (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
          }
        }
        else if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x24e,"ProcessFetchedData",logERR,
                 "Requesting RealTraffic weather returned error \'%s\':\n%s",s._M_dataplus._M_p,
                 (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
        }
        iVar4 = (this->rtWx).nErr;
        (this->rtWx).nErr = iVar4 + 1;
        if (NAN((this->rtWx).QNH)) {
          if (iVar4 < 4) {
            lVar6 = std::chrono::_V2::steady_clock::now();
            (this->tNextWeather).__d.__r = lVar6 + 60000000000;
          }
          else {
            if ((int)dataRefs.iLogLevel < 4) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x25a,"ProcessFetchedData",logERR,
                     "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                    );
            }
            CreateMsgWindow(12.0,logERR,
                            "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                           );
            lVar6 = (this->curr).tOff;
            (this->rtWx).QNH = 1013.25;
            (this->rtWx).tOff = lVar6;
            lVar6 = std::chrono::_V2::steady_clock::now();
            (this->rtWx).next.__d.__r = lVar6 + 60000000000;
            (this->rtWx).pos._lat = NAN;
            (this->rtWx).pos._lon = NAN;
            (this->rtWx).pos._alt = NAN;
            (this->rtWx).pos._ts = NAN;
            (this->rtWx).pos._head = NAN;
            (this->rtWx).pos._pitch = NAN;
            (this->rtWx).pos._roll = NAN;
            (this->rtWx).pos.mergeCount = 1;
            (this->rtWx).pos.f = (posFlagsTy)0x0;
            (this->rtWx).pos.edgeIdx = 0xffffffffffffffff;
          }
        }
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&s);
      break;
    default:
      lVar6 = jog_l(pJVar5,"dataepoch");
      if (0x5c2b5640 < lVar6) {
        if ((long)(dataRefs.fdBufPeriod / 2) + (long)dataRefs.lastSimTime < lVar6) {
          if (0.0 < this->tsAdjust) {
            if ((int)dataRefs.iLogLevel < 2) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x29b,"ProcessFetchedData",logINFO,
                     "RealTraffic: Tracking data is real-time again.");
            }
            CreateMsgWindow(8.0,logINFO,"RealTraffic: Tracking data is real-time again.");
          }
          this->tsAdjust = 0.0;
        }
        else {
          lVar6 = (long)dataRefs.lastSimTime - lVar6;
          lVar6 = ((lVar6 + dataRefs.fdBufPeriod) - (lVar6 + dataRefs.fdBufPeriod + -10) % 0x3c) +
                  0x32;
          if (lVar6 != (long)this->tsAdjust) {
            this->tsAdjust = (double)lVar6;
            if ((int)dataRefs.iLogLevel < 2) {
              GetAdjustTSText_abi_cxx11_(&s,this);
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x2a6,"ProcessFetchedData",logINFO,
                     "RealTraffic: Receive and display past tracking data from %s",
                     s._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&s);
            }
            GetAdjustTSText_abi_cxx11_(&s,this);
            CreateMsgWindow(8.0,logINFO,
                            "RealTraffic: Receive and display past tracking data from %s",
                            s._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&s);
          }
        }
      }
      lVar6 = jog_l(pJVar5,"full_count");
      this->lTotalFlights = lVar6;
      if ((lVar6 == 0) &&
         (dVar11.__r = std::chrono::_V2::steady_clock::now(),
         300000000000 < dVar11.__r - (long)ProcessFetchedData::prevWarn.__d.__r)) {
        pcVar7 = "(full_count=0)";
        if ((int)dataRefs.iLogLevel < 3) {
          pcVar13 = "(full_count=0)";
          if (0 < (this->curr).tOff) {
            pcVar13 = "Maybe requested historic data too far in the past?";
          }
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x2b3,"ProcessFetchedData",logWARN,"RealTraffic has no traffic at all! %s",pcVar13
                );
        }
        if (0 < (this->curr).tOff) {
          pcVar7 = "Maybe requested historic data too far in the past?";
        }
        CreateMsgWindow(8.0,logWARN,"RealTraffic has no traffic at all! %s",pcVar7);
        ProcessFetchedData::prevWarn.__d.__r = (duration)(duration)dVar11.__r;
      }
      pJVar5 = json_object_get_object(pJVar5,"data");
      if (pJVar5 == (JSON_Object *)0x0) {
        if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x2bd,"ProcessFetchedData",logERR,
                 "Response is missing the \'data\' object that would have the aircraft data!");
        }
        (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8]
        )(this);
        goto LAB_0017aa60;
      }
      iVar4 = json_object_has_value_of_type(pJVar5,"buffer_0",4);
      if (iVar4 == 0) {
        bVar3 = ProcessTrafficBuffer(this,pJVar5);
      }
      else {
        sVar12 = json_object_get_count(pJVar5);
        uVar14 = (int)sVar12 - 1;
        bVar3 = true;
        while (0 < (int)(uVar14 + 1)) {
          snprintf((char *)&s,0x14,"buffer_%d",(ulong)uVar14);
          pBuf = json_object_get_object(pJVar5,(char *)&s);
          bVar2 = ProcessTrafficBuffer(this,pBuf);
          bVar15 = uVar14 == 0;
          uVar14 = uVar14 - 1;
          if (!bVar2 && bVar15) {
            if ((int)dataRefs.iLogLevel < 3) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x2cd,"ProcessFetchedData",logWARN,"Couldn\'t process \'buffer_0\'!");
            }
            (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[8])(this);
            bVar3 = false;
          }
        }
      }
    }
    goto LAB_0017aa62;
  }
LAB_0017aa60:
  bVar3 = false;
LAB_0017aa62:
  std::__cxx11::string::~string((string *)&rMsg);
LAB_0017aa6c:
  std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::~unique_ptr
            (&pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>);
  return bVar3;
}

Assistant:

bool RealTrafficConnection::ProcessFetchedData ()
{
    // No data!
    if (!netDataPos) {
        if (httpResponse != HTTP_OK)
            IncErrCnt();
        return false;
    }
    
    // Try to parse as JSON...even in case of errors we might be getting a body
    // Unique_ptr ensures it is freed before leaving the function
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) { LOG_MSG(logERR,ERR_JSON_MAIN_OBJECT); IncErrCnt(); return false; }
    
    // Try the error fields first
    long rStatus = jog_l(pObj, "status");
    if (!rStatus) { LOG_MSG(logERR,"Response has no 'status'"); IncErrCnt(); return false; }
    
    std::string rMsg = jog_s(pObj, "message");
    
    // --- Error processing ---
    
    // For failed weather requests keep a separate counter
    if (curr.eRequType == CurrTy::RT_REQU_WEATHER && rStatus != HTTP_OK) {
        if (++rtWx.nErr >= RT_DRCT_MAX_WX_ERR) { // Too many WX errors?
            SHOW_MSG(logERR, "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude.");
        }
    }
    
    switch (rStatus) {
        case HTTP_OK:
            break;                                  // All good, just continue
            
        case HTTP_PAYMENT_REQU:
        case HTTP_NOT_FOUND:
            if (curr.eRequType == CurrTy::RT_REQU_AUTH) {
                SHOW_MSG(logERR, "RealTraffic license invalid: %s", rMsg.c_str());
                SetValid(false,true);               // set invalid, stop trying
                return false;
            } else {
                LOG_MSG(logWARN, "RealTraffic returned: %s", rMsg.c_str());
                IncErrCnt();
                tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
                return false;
            }
            
        case HTTP_METH_NOT_ALLWD:                   // Send for "too many sessions" / "request rate violation"
            LOG_MSG(logERR, "RealTraffic: %s", rMsg.c_str());
            IncErrCnt();
            // documentation says "wait 10 seconds"
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_RATE;
            curr.sGUID.clear();                     // force re-login
            return false;
            
        case HTTP_UNAUTHORIZED:                     // means our GUID expired
            LOG_MSG(logDEBUG, "Session expired");
            curr.sGUID.clear();                     // re-login immediately
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now();
            return false;
            
        case HTTP_FORBIDDEN:
            LOG_MSG(logWARN, "RealTraffic forbidden: %s", rMsg.c_str());
            IncErrCnt();
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
            return false;
            
        case HTTP_INTERNAL_ERR:
        default:
            SHOW_MSG(logERR, "RealTraffic returned an error: %s", rMsg.c_str());
            IncErrCnt();
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
            return false;
    }
    
    // All good, process the request
    
    // Wait till next request?
    long rrl = jog_l(pObj, "rrl");                  // Wait time till next request, separately for traffic and weather
    long wrrl = jog_l(pObj, "wrrl");
    switch (curr.eRequType) {
        case CurrTy::RT_REQU_AUTH:                  // in most cases we continue as quickly as possible
        case CurrTy::RT_REQU_DEAUTH:
        case CurrTy::RT_REQU_PARKED:
        case CurrTy::RT_REQU_WEATHER:
            break;
        case CurrTy::RT_REQU_NEAREST_METAR:         // after learning the META we continue quickly with the weather request
            wrrl = 50;
            break;
        case CurrTy::RT_REQU_TRAFFIC:               // By default we wait at least 8s, or more if RealTraffic instructs us so
            if (rrl < RT_DRCT_DEFAULT_WAIT)
                rrl = RT_DRCT_DEFAULT_WAIT;
            break;
    }
    if (rrl > 0)
        tNextTraffic = std::chrono::steady_clock::now() + std::chrono::milliseconds(rrl);
    if (wrrl > 0)
        tNextWeather = std::chrono::steady_clock::now() + std::chrono::milliseconds(wrrl);
    
    // --- Authorization ---
    if (curr.eRequType == CurrTy::RT_REQU_AUTH) {
        eLicType = RTLicTypeTy(jog_l(pObj, "type"));
        curr.sGUID = jog_s(pObj, "GUID");
        if (curr.sGUID.empty()) {
            LOG_MSG(logERR, "Did not actually receive a GUID:\n%s", netData);
            IncErrCnt();
            return false;
        }
        LOG_MSG(logDEBUG, "Authenticated: type=%d, GUID=%s",
                eLicType, curr.sGUID.c_str());
        return true;
    }
    
    // --- De-authentication (closing the session) ---
    if (curr.eRequType == CurrTy::RT_REQU_DEAUTH) {
        curr.sGUID.clear();
        LOG_MSG(logDEBUG, "De-authenticated");
        return true;
    }
    
    // --- Nearest METAR location ---
    if (curr.eRequType == CurrTy::RT_REQU_NEAREST_METAR) {
        ProcessNearestMETAR(json_object_get_array(pObj, "data"));
        return true;
    }
    
    // --- Weather ---
    if (curr.eRequType == CurrTy::RT_REQU_WEATHER) {
        // Here, we are interested in just a single value: local Pressure
        double wxQNH = jog_n_nan(pObj, "data.QNH");         // ideally QNH
        if (std::isnan(wxQNH))
            wxQNH = jog_n_nan(pObj, "data.locWX.SLP");      // of not given then SLP
        
        // Error in locWX data?
        std::string s = jog_s(pObj, "data.locWX.Error");                    // sometimes errors are given in a specific field
        if (s.empty()) {                                                    // and at other times there is something in the 'Info' field...not very consistent
            s = jog_s(pObj, "data.locWX.Info");
            if (!s.empty() &&
                s != "TinyDelta" &&                                         // if we request too often then Info is 'TinyDelta', and we let it sit in 's'
                s.substr(0,6) != "error:")                                  // any error starts with "error:" and we let it sit in 's'
                s.clear();
        }
        
        // Any error, either explicitely or because local pressure is bogus?
        if (!s.empty() || std::isnan(wxQNH) || wxQNH < 800.0)
        {
            if (s == "File requested") {
                // Error "File requested" often occurs when requesting historic weather that isn't cached on the server, so we only issue debug-level message
                LOG_MSG(logDEBUG, "Weather details being fetched at RealTraffic, will try again in 60s");
            } else {
                // Anything else is unexpected
                if (!s.empty()) {
                    LOG_MSG(logERR, "Requesting RealTraffic weather returned error '%s':\n%s",
                            s.c_str(), netData);
                } else {
                    LOG_MSG(logERR, "RealTraffic returned no or invalid local pressure %.1f:\n%s",
                            wxQNH, netData);
                }
            }
            // one more error
            ++rtWx.nErr;
            // If we don't yet have any pressure...
            if (std::isnan(rtWx.QNH)) {
                // Too many WX errors? We give up and just use standard pressure
                if (rtWx.nErr >= RT_DRCT_MAX_WX_ERR) {
                    SHOW_MSG(logERR, "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude.");
                    rtWx.set(HPA_STANDARD, curr.tOff, false);
                    rtWx.pos = positionTy();
                } else {
                    // We will request weather directly again, but need to wait 60s for it
                    tNextWeather = std::chrono::steady_clock::now() + std::chrono::seconds(60);
                }
            }
            return false;
        }
        
        // If we have METAR info pass that on, too
        s = jog_s(pObj, "data.ICAO");
        std::string metar = jog_s(pObj, "data.METAR");
        
        if (s.empty() || s == "UNKN") {         // ignore no/unknown METAR
            s.clear();
            metar.clear();
        }
            
        // If this is live data, not historic, then we can use it instead of separately querying METAR
        if (!isHistoric()) {
            rtWx.w.qnh_pas = dataRefs.SetWeather((float)wxQNH,
                                                 (float)rtWx.pos.lat(), (float)rtWx.pos.lon(),
                                                 s, metar);
        }
        // historic data
        else {
            // Try reading QNH from METAR
            rtWx.w.qnh_pas = WeatherQNHfromMETAR(metar);
        }
        
        // Successfully received local pressure information
        rtWx.set(std::isnan(rtWx.w.qnh_pas) ? wxQNH : double(rtWx.w.qnh_pas), curr.tOff);   // Save new QNH
        LOG_MSG(logDEBUG, "Received RealTraffic Weather with QNH = %.1f", rtWx.QNH);
        
        // If requested to set X-Plane's weather based on detailed weather data
        if (dataRefs.GetWeatherControl() == WC_REAL_TRAFFIC) {
            ProcessWeather (json_object_get_object(pObj, "data"));
            if (std::isnan(rtWx.w.qnh_pas))
                rtWx.w.qnh_pas = float(rtWx.QNH);
        }
        
        return true;
    }
    
    // --- Parked Aircraft ---
    if (curr.eRequType == CurrTy::RT_REQU_PARKED) {
        bDoParkedTraffic = false;                       // Repeat only when instructed
        return ProcessParkedAcBuffer(json_object_get_object(pObj, "data"));
    }

    // --- Traffic data ---
    
    // In `dataepoch` RealTraffic delivers the point in time when the data was valid.
    // That is relevant especially for historic data, when `dataepoch` is in the past.
    const long epoch = jog_l(pObj, "dataepoch");
    if (epoch > long(JAN_FIRST_2019))
    {
        // "now" is the simulated time plus the buffering period
        const long simTime  = long(dataRefs.GetSimTime());
        const long bufTime  = long(dataRefs.GetFdBufPeriod());
        // As long as the timestamp is half the buffer time close to "now" we consider the data current, ie. non-historic
        if (epoch > simTime + bufTime/2) {
            if (tsAdjust > 0.0) {                       // is that a change from historic delivery?
                SHOW_MSG(logINFO, INFO_RT_REAL_TIME);
            }
            tsAdjust = 0.0;
        }
        // we have historic data
        else {
            long diff = simTime + bufTime - epoch;      // difference between "now"
            diff -= 10;                                 // rounding 10s above the minute down,
            diff += 60 - diff % 60;                     // everything else up to the next minute
            if (long(tsAdjust) != diff) {               // is this actually a change?
                tsAdjust = double(diff);
                SHOW_MSG(logINFO, INFO_RT_ADJUST_TS, GetAdjustTSText().c_str());
            }
        }
    }